

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

void __thiscall QBoxLayout::addStrut(QBoxLayout *this,int size)

{
  bool bVar1;
  QBoxLayoutPrivate *layout;
  QSpacerItem *it_00;
  QBoxLayoutItem *this_00;
  long *in_RDI;
  QBoxLayoutItem *it;
  QLayoutItem *b;
  QBoxLayoutPrivate *d;
  undefined8 in_stack_ffffffffffffffd8;
  Policy hPolicy;
  undefined1 *puVar2;
  int w;
  
  layout = d_func((QBoxLayout *)0x2f5940);
  puVar2 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = horz(layout->dir);
  hPolicy = (Policy)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  w = (int)((ulong)puVar2 >> 0x20);
  if (bVar1) {
    it_00 = QLayoutPrivate::createSpacerItem
                      ((QLayout *)layout,w,(int)puVar2,hPolicy,(Policy)in_stack_ffffffffffffffd8);
  }
  else {
    it_00 = QLayoutPrivate::createSpacerItem
                      ((QLayout *)layout,w,(int)puVar2,hPolicy,(Policy)in_stack_ffffffffffffffd8);
  }
  this_00 = (QBoxLayoutItem *)operator_new(0x10);
  QBoxLayoutItem::QBoxLayoutItem(this_00,&it_00->super_QLayoutItem,0);
  this_00->magic = true;
  QList<QBoxLayoutItem_*>::append((QList<QBoxLayoutItem_*> *)0x2f59ec,this_00);
  (**(code **)(*in_RDI + 0x70))();
  return;
}

Assistant:

void QBoxLayout::addStrut(int size)
{
    Q_D(QBoxLayout);
    QLayoutItem *b;
    if (horz(d->dir))
        b = QLayoutPrivate::createSpacerItem(this, 0, size, QSizePolicy::Fixed, QSizePolicy::Minimum);
    else
        b = QLayoutPrivate::createSpacerItem(this, size, 0, QSizePolicy::Minimum, QSizePolicy::Fixed);

    QBoxLayoutItem *it = new QBoxLayoutItem(b);
    it->magic = true;
    d->list.append(it);
    invalidate();
}